

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O3

bool __thiscall
Inferences::InductionClauseIterator::isValidBound
          (InductionClauseIterator *this,InductionContext *context,Bound *bound)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  Term *pTVar3;
  Term *t;
  Term *pTVar4;
  Literal **lit;
  _Hash_node_base *p_Var5;
  
  t = getPlaceholderForTerm(&context->_indTerms,0);
  p_Var1 = (context->_cls)._M_h._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return true;
    }
    p_Var2 = p_Var1[4]._M_nxt;
    for (p_Var5 = p_Var1[3]._M_nxt; p_Var5 != p_Var2; p_Var5 = p_Var5 + 1) {
      pTVar4 = InductionHelper::getOtherTermFromComparison((Literal *)p_Var5->_M_nxt,t);
      pTVar3 = *(Term **)(bound->_inner)._content;
      if ((undefined1  [36])((undefined1  [36])bound->_inner & (undefined1  [36])0x1) ==
          (undefined1  [36])0x0) {
        if (*(_Hash_node_base **)((bound->_inner)._content + 0x18) == p_Var1[1]._M_nxt) {
          return false;
        }
        if (pTVar4 == pTVar3) {
          return false;
        }
      }
      else if (pTVar4 == pTVar3) {
        return false;
      }
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

bool InductionClauseIterator::isValidBound(const InductionContext& context, const Bound& bound)
{
  ASS_EQ(context._indTerms.size(), 1);
  Term* pt = getPlaceholderForTerm(context._indTerms,0);
  for (const auto& kv : context._cls) {
    for (const auto& lit : kv.second) {
      ASS((lit != nullptr) && (kv.first != nullptr));
      Term* otherArg = InductionHelper::getOtherTermFromComparison(lit, pt);
      if (!bound.match(
            [&](TermLiteralClause const&  bound) 
            { return InductionHelper::isValidBound(otherArg, kv.first, bound); },
            [&](DefaultBound const& bound) 
            { return InductionHelper::isValidForDefaultBound(otherArg, kv.first, bound.term); }
            )) {
        return false;
      }
    }
  }
  return true;
}